

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O0

vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
* Test_Helper::uniformImages(uint32_t count,uint32_t width,uint32_t height)

{
  bool bVar1;
  ulong __n;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  iterator im;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *image;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff54;
  uint8_t in_stack_ffffffffffffff56;
  uint8_t in_stack_ffffffffffffff57;
  ImageTemplate<unsigned_char> *this;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this_00;
  __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
  local_30 [3];
  undefined1 local_15;
  undefined4 local_14;
  undefined4 local_10;
  
  local_15 = 0;
  __n = (ulong)in_ESI;
  this_00 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)&stack0xffffffffffffffea;
  this = in_RDI;
  local_14 = in_ECX;
  local_10 = in_EDX;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x183b47);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(this_00,__n,(allocator_type *)this);
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x183b6a);
  local_30[0]._M_current =
       (ImageTemplate<unsigned_char> *)
       std::
       vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
       ::begin(in_stack_ffffffffffffff48);
  while( true ) {
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::end((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           *)in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,
                                   CONCAT16(in_stack_ffffffffffffff56,
                                            CONCAT24(in_stack_ffffffffffffff54,
                                                     in_stack_ffffffffffffff50))),
                       (__normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff54 = (undefined2)local_14;
    in_stack_ffffffffffffff56 = (uint8_t)((uint)local_14 >> 0x10);
    in_stack_ffffffffffffff57 = (uint8_t)((uint)local_14 >> 0x18);
    in_stack_ffffffffffffff50 = local_10;
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (this,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,in_stack_ffffffffffffff57,
               in_stack_ffffffffffffff56);
    uniformImage((uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
                 (Image *)CONCAT17(in_stack_ffffffffffffff57,
                                   CONCAT16(in_stack_ffffffffffffff56,
                                            CONCAT24(in_stack_ffffffffffffff54,
                                                     in_stack_ffffffffffffff50))));
    __gnu_cxx::
    __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
    ::operator*(local_30);
    PenguinV_Image::ImageTemplate<unsigned_char>::operator=
              ((ImageTemplate<unsigned_char> *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,
                                 CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))),
               in_stack_ffffffffffffff48);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x183c1a);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x183c24);
    __gnu_cxx::
    __normal_iterator<PenguinV_Image::ImageTemplate<unsigned_char>_*,_std::vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
    ::operator++(local_30);
  }
  return (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          *)in_RDI;
}

Assistant:

std::vector< PenguinV_Image::Image > uniformImages( uint32_t count, uint32_t width, uint32_t height )
    {
        std::vector < PenguinV_Image::Image > image( count );

        for( std::vector< PenguinV_Image::Image >::iterator im = image.begin(); im != image.end(); ++im )
            *im = uniformImage( width, height );

        return image;
    }